

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<ImPlotRange>::dealloc(value_and_holder *v_h)

{
  bool bVar1;
  unique_ptr<ImPlotRange,_std::default_delete<ImPlotRange>_> *this;
  ImPlotRange **ppIVar2;
  void **ppvVar3;
  undefined1 local_28 [8];
  error_scope scope;
  value_and_holder *v_h_local;
  
  scope.trace = (PyObject *)v_h;
  error_scope::error_scope((error_scope *)local_28);
  bVar1 = pybind11::detail::value_and_holder::holder_constructed((value_and_holder *)scope.trace);
  if (bVar1) {
    this = pybind11::detail::value_and_holder::
           holder<std::unique_ptr<ImPlotRange,std::default_delete<ImPlotRange>>>
                     ((value_and_holder *)scope.trace);
    std::unique_ptr<ImPlotRange,_std::default_delete<ImPlotRange>_>::~unique_ptr(this);
    pybind11::detail::value_and_holder::set_holder_constructed
              ((value_and_holder *)scope.trace,false);
  }
  else {
    ppIVar2 = pybind11::detail::value_and_holder::value_ptr<ImPlotRange>
                        ((value_and_holder *)scope.trace);
    pybind11::detail::call_operator_delete
              (*ppIVar2,*(size_t *)(scope.trace[1].ob_refcnt + 0x10),
               *(size_t *)(scope.trace[1].ob_refcnt + 0x18));
  }
  ppvVar3 = pybind11::detail::value_and_holder::value_ptr<void>((value_and_holder *)scope.trace);
  *ppvVar3 = (void *)0x0;
  error_scope::~error_scope((error_scope *)local_28);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }